

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void mainfunc(LexState *ls,FuncState *fs)

{
  Upvaldesc *pUVar1;
  Upvaldesc *env;
  BlockCnt bl;
  FuncState *fs_local;
  LexState *ls_local;
  
  bl._16_8_ = fs;
  open_func(ls,fs,(BlockCnt *)&env);
  setvararg((FuncState *)bl._16_8_,0);
  pUVar1 = allocupvalue((FuncState *)bl._16_8_);
  pUVar1->instack = '\x01';
  pUVar1->idx = '\0';
  pUVar1->kind = '\0';
  pUVar1->name = ls->envn;
  if (((*(byte *)(*(long *)bl._16_8_ + 9) & 0x20) != 0) && ((pUVar1->name->marked & 0x18) != 0)) {
    luaC_barrier_(ls->L,*(GCObject **)bl._16_8_,(GCObject *)pUVar1->name);
  }
  luaX_next(ls);
  statlist(ls);
  check(ls,0x120);
  close_func(ls);
  return;
}

Assistant:

static void mainfunc (LexState *ls, FuncState *fs) {
  BlockCnt bl;
  Upvaldesc *env;
  open_func(ls, fs, &bl);
  setvararg(fs, 0);  /* main function is always declared vararg */
  env = allocupvalue(fs);  /* ...set environment upvalue */
  env->instack = 1;
  env->idx = 0;
  env->kind = VDKREG;
  env->name = ls->envn;
  luaC_objbarrier(ls->L, fs->f, env->name);
  luaX_next(ls);  /* read first token */
  statlist(ls);  /* parse main body */
  check(ls, TK_EOS);
  close_func(ls);
}